

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v8::detail::
       parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  width_adapter local_60;
  int local_58;
  bool local_51;
  int width;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *handler_local;
  char *end_local;
  char *begin_local;
  char local_29;
  width_adapter *pwStack_28;
  char c;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *local_20;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *local_18;
  specs_checker<fmt::v8::detail::specs_handler<char>_> *local_10;
  
  local_51 = begin != end;
  _width = handler;
  handler_local = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end;
  end_local = begin;
  ignore_unused<bool,char[1]>(&local_51,(char (*) [1])0x29554e);
  if ((*end_local < '0') || ('9' < *end_local)) {
    if (*end_local == '{') {
      end_local = end_local + 1;
      if ((specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local != handler_local) {
        local_60.handler = _width;
        local_20 = handler_local;
        pwStack_28 = &local_60;
        local_29 = *(char *)&(((specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local)->
                             super_specs_handler<char>).super_specs_setter<char>.specs_;
        local_18 = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local;
        if ((local_29 == '}') || (local_29 == ':')) {
          parse_width<char,_fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>_>_&>
          ::width_adapter::operator()(pwStack_28);
          local_10 = local_18;
        }
        else {
          local_10 = (specs_checker<fmt::v8::detail::specs_handler<char>_> *)
                     do_parse_arg_id<char,fmt::v8::detail::parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&)::width_adapter&>
                               (end_local,(char *)handler_local,pwStack_28);
        }
        end_local = (char *)local_10;
      }
      if (((specs_checker<fmt::v8::detail::specs_handler<char>_> *)end_local == handler_local) ||
         (*end_local != '}')) {
        specs_handler<char>::on_error(&_width->super_specs_handler<char>,"invalid format string");
        return end_local;
      }
      end_local = end_local + 1;
    }
  }
  else {
    local_58 = parse_nonnegative_int<char>(&end_local,(char *)handler_local,-1);
    if (local_58 == -1) {
      specs_handler<char>::on_error(&_width->super_specs_handler<char>,"number is too big");
    }
    else {
      specs_setter<char>::on_width((specs_setter<char> *)_width,local_58);
    }
  }
  return end_local;
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}